

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O1

bool __thiscall imrt::Station::isOpenBeamlet(Station *this,int beam,int aperture)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  pair<int,_int> pVar4;
  int y;
  int x;
  
  pVar4 = Collimator::indexToPos(this->collimator,beam,this->angle);
  x = pVar4.first;
  y = pVar4.second;
  bVar3 = Collimator::isActiveBeamAngle(this->collimator,x,y,this->angle);
  if (bVar3) {
    lVar2 = *(long *)&(this->A).
                      super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[aperture].
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data;
    iVar1 = *(int *)(lVar2 + (long)x * 8);
    bVar3 = false;
    if ((-1 < iVar1) && (bVar3 = false, iVar1 <= y)) {
      bVar3 = y <= *(int *)(lVar2 + 4 + (long)x * 8);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Station::isOpenBeamlet(int beam, int aperture) {
  	auto coord = collimator.indexToPos(beam, angle);
        if (!collimator.isActiveBeamAngle(coord.first, coord.second,angle)) return(false);
    //cout << "Checking beamlet: " << beam << " angle:" << aperture << endl;
    //cout << "Position: " << coord.first << "," << coord.second << endl;
  	if (A[aperture][coord.first].first < 0 || A[aperture][coord.first].first > coord.second || A[aperture][coord.first].second< coord.second)
  	  return(false);
  	//cout << "Not closed" << endl;
  	return(true);
  }